

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Packet.cpp
# Opt level: O2

Packet * __thiscall mognetwork::Packet::operator>>(Packet *this,string *data)

{
  uint uVar1;
  pointer pcVar2;
  void *__dest;
  uint uVar3;
  ulong __n;
  int32_t size;
  uint local_34;
  
  local_34 = 0;
  operator>>(this,(int *)&local_34);
  __n = (ulong)local_34;
  if (0 < (int)local_34) {
    uVar1 = this->m_readerPos;
    uVar3 = uVar1 + local_34;
    pcVar2 = (this->m_data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)uVar3 <=
        (ulong)((long)(this->m_data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)pcVar2)) {
      __dest = operator_new__(__n + 1);
      memcpy(__dest,pcVar2 + uVar1,__n);
      *(undefined1 *)((long)__dest + __n) = 0;
      this->m_readerPos = uVar3;
      std::__cxx11::string::append((char *)data);
      operator_delete(__dest);
    }
  }
  return this;
}

Assistant:

Packet& Packet::operator>>(std::string& data)
  {
    int32_t size = 0;
    *this >> size;

    if (size > 0 && verifySize(size))
      {
	char *buffer = new char[size + 1];
	memcpy(buffer, &((*m_data)[m_readerPos]), size);
	buffer[size] = '\0';
	m_readerPos += size;
	data.append(buffer);
	delete buffer;
      }
    return (*this);
  }